

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KM_tai.cpp
# Opt level: O0

void Kumu::caltime_utc(caltime *ct,tai *t)

{
  uint uVar1;
  ulong uVar2;
  i32_t s;
  ui64_t u;
  tai t2;
  tai *t_local;
  caltime *ct_local;
  
  if (ct == (caltime *)0x0 || t == (tai *)0x0) {
    __assert_fail("ct&&t",
                  "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/KM_tai.cpp"
                  ,0x97,"void Kumu::caltime_utc(Kumu::TAI::caltime *, const Kumu::TAI::tai *)");
  }
  uVar2 = t->x + 0xe476;
  uVar1 = (uint)(uVar2 % 0x15180);
  ct->second = uVar1 % 0x3c;
  uVar1 = uVar1 / 0x3c;
  ct->minute = uVar1 % 0x3c;
  ct->hour = uVar1 / 0x3c;
  caldate_frommjd(&ct->date,(int)(uVar2 / 0x15180) + 0x6ebf01e8);
  ct->offset = 0;
  return;
}

Assistant:

void
caltime_utc(Kumu::TAI::caltime* ct, const Kumu::TAI::tai* t)
{
  assert(ct&&t);
  Kumu::TAI::tai t2 = *t;
  ui64_t u = t2.x + 58486;
  i32_t s = (i32_t)(u % ui64_C(86400));

  ct->second = (s % 60); s /= 60;
  ct->minute = s % 60; s /= 60;
  ct->hour = s;

  u /= ui64_C(86400);
  caldate_frommjd(&ct->date,/*XXX*/(i32_t) (u - ui64_C(53375995543064)));

  ct->offset = 0;
}